

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

void ModifyDropAmount(AInventory *inv,int dropamount)

{
  byte *pbVar1;
  DObject *pDVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  PClass *pPVar7;
  double dVar8;
  
  dVar3 = G_SkillProperty(SKILLP_DropAmmoFactor);
  if (dropamount < 1) {
    dVar8 = (double)(~-(ulong)(dVar3 == -1.0) & (ulong)dVar3 |
                    -(ulong)(dVar3 == -1.0) & 0x3fe0000000000000);
    bVar4 = DObject::IsKindOf((DObject *)inv,AAmmo::RegistrationInfo.MyClass);
    if (bVar4) {
      pPVar7 = DObject::GetClass((DObject *)inv);
      iVar6 = *(int *)&pPVar7[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.super_PTypeBase.super_DObject;
      if ((iVar6 < 1) && (iVar5 = (int)(dVar8 * (double)inv->Amount), iVar6 = 1, 1 < iVar5)) {
        iVar6 = iVar5;
      }
      inv->Amount = iVar6;
    }
    else {
      bVar4 = DObject::IsKindOf((DObject *)inv,AWeaponGiver::RegistrationInfo.MyClass);
      if (bVar4) {
        inv[1].super_AActor.Angles.Pitch.Degrees = dVar8;
      }
      else {
        bVar4 = DObject::IsKindOf((DObject *)inv,AWeapon::RegistrationInfo.MyClass);
        if (!bVar4) {
          bVar4 = DObject::IsKindOf((DObject *)inv,ADehackedPickup::RegistrationInfo.MyClass);
          if (!bVar4) {
            return;
          }
          *(undefined1 *)&inv[1].super_AActor.super_DThinker.super_DObject.Class = 1;
          return;
        }
        pDVar2 = inv[1].super_AActor.super_DThinker.super_DObject.ObjNext;
        inv[1].super_AActor.super_DThinker.super_DObject.ObjNext =
             (DObject *)
             CONCAT44((int)(dVar8 * (double)(int)((ulong)pDVar2 >> 0x20)),
                      (int)(dVar8 * (double)(int)pDVar2));
      }
    }
    inv->ItemFlags = inv->ItemFlags | (-(uint)(dVar3 != -1.0) & 1) << 0xe;
  }
  else if (((dVar3 == -1.0) && (!NAN(dVar3))) ||
          (bVar4 = DObject::IsKindOf((DObject *)inv,AAmmo::RegistrationInfo.MyClass), !bVar4)) {
    inv->Amount = dropamount;
  }
  else {
    inv->Amount = (int)(dVar3 * (double)dropamount);
    pbVar1 = (byte *)((long)&inv->ItemFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  return;
}

Assistant:

void ModifyDropAmount(AInventory *inv, int dropamount)
{
	int flagmask = IF_IGNORESKILL;
	double dropammofactor = G_SkillProperty(SKILLP_DropAmmoFactor);
	// Default drop amount is half of regular amount * regular ammo multiplication
	if (dropammofactor == -1) 
	{
		dropammofactor = 0.5;
		flagmask = 0;
	}

	if (dropamount > 0)
	{
		if (flagmask != 0 && inv->IsKindOf(RUNTIME_CLASS(AAmmo)))
		{
			inv->Amount = int(dropamount * dropammofactor);
			inv->ItemFlags |= IF_IGNORESKILL;
		}
		else
		{
			inv->Amount = dropamount;
		}
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		// Half ammo when dropped by bad guys.
		int amount = static_cast<PClassAmmo *>(inv->GetClass())->DropAmount;
		if (amount <= 0)
		{
			amount = MAX(1, int(inv->Amount * dropammofactor));
		}
		inv->Amount = amount;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeaponGiver)))
	{
		static_cast<AWeaponGiver *>(inv)->DropAmmoFactor = dropammofactor;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// The same goes for ammo from a weapon.
		static_cast<AWeapon *>(inv)->AmmoGive1 = int(static_cast<AWeapon *>(inv)->AmmoGive1 * dropammofactor);
		static_cast<AWeapon *>(inv)->AmmoGive2 = int(static_cast<AWeapon *>(inv)->AmmoGive2 * dropammofactor);
		inv->ItemFlags |= flagmask;
	}			
	else if (inv->IsKindOf (RUNTIME_CLASS(ADehackedPickup)))
	{
		// For weapons and ammo modified by Dehacked we need to flag the item.
		static_cast<ADehackedPickup *>(inv)->droppedbymonster = true;
	}
}